

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O1

void add_object(state *s,uint32_t handle,uint32_t class)

{
  rnnenum *prVar1;
  rnnenum *prVar2;
  rnndeccontext *ctx;
  rnnvalue *prVar3;
  char *pcVar4;
  rnnvalue *prVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  prVar1 = rnn_findenum(s->db,"chipset");
  prVar2 = rnn_findenum(s->db,"obj-class");
  if ((prVar2 == (rnnenum *)0x0) || (prVar1 == (rnnenum *)0x0)) {
    add_object_cold_1();
  }
  lVar7 = 0;
  while (*(int *)((long)&s->objects[0].handle + lVar7) != 0) {
    lVar7 = lVar7 + 0x18;
    if (lVar7 == 0x1800) {
      add_object_cold_2();
      return;
    }
  }
  *(uint32_t *)((long)&s->objects[0].handle + lVar7) = handle;
  *(uint32_t *)((long)&s->objects[0].class + lVar7) = class;
  ctx = rnndec_newcontext(s->db);
  *(rnndeccontext **)((long)&s->objects[0].ctx + lVar7) = ctx;
  ctx->colors = s->colors;
  if ((long)prVar1->valsnum < 1) {
    prVar3 = (rnnvalue *)0x0;
  }
  else {
    lVar6 = 0;
    do {
      prVar3 = prVar1->vals[lVar6];
      if (prVar3->value == (ulong)s->chipset) break;
      bVar8 = (long)prVar1->valsnum + -1 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar8);
  }
  pcVar4 = "NV1";
  if ((prVar3 != (rnnvalue *)0x0) && (prVar3->value == (ulong)s->chipset)) {
    pcVar4 = prVar3->name;
  }
  rnndec_varadd(ctx,"chipset",pcVar4);
  lVar6 = 0;
  do {
    prVar3 = prVar2->vals[lVar6];
    if (prVar3->value == (ulong)class) break;
    bVar8 = (ulong)(uint)prVar2->valsnum - 1 != lVar6;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  prVar5 = (rnnvalue *)0x0;
  if (prVar3->value != (ulong)class) {
    prVar3 = prVar5;
  }
  if (prVar3 != (rnnvalue *)0x0) {
    prVar5 = (rnnvalue *)prVar3->name;
  }
  *(rnnvalue **)((long)&s->objects[0].name + lVar7) = prVar5;
  if (prVar3 == (rnnvalue *)0x0) {
    pcVar4 = "NV1_NULL";
  }
  else {
    pcVar4 = prVar3->name;
  }
  rnndec_varadd(*(rnndeccontext **)((long)&s->objects[0].ctx + lVar7),"obj-class",pcVar4);
  return;
}

Assistant:

void
add_object(struct state *s, uint32_t handle, uint32_t class)
{
	struct rnnenum *chs = rnn_findenum(s->db, "chipset");
	struct rnnenum *cls = rnn_findenum(s->db, "obj-class");
	struct rnnvalue *v;
	struct obj *obj;
	int i;

	if (!cls || !chs) {
		fprintf(stderr, "No obj-class/chipset enum found\n");
		abort();
	}

	for (i = 0; obj = &s->objects[i], i < MAX_OBJECTS; i++) {
		if (!obj->handle) {
			obj->handle = handle;
			obj->class = class;
			obj->ctx = rnndec_newcontext(s->db);
			obj->ctx->colors = s->colors;

			v = NULL;
			FINDARRAY(chs->vals, v, v->value == s->chipset);
			rnndec_varadd(obj->ctx, "chipset",
				      v ? v->name : "NV1");

			v = NULL;
			FINDARRAY(cls->vals, v, v->value == class);
			obj->name = v ? v->name : NULL;
			rnndec_varadd(obj->ctx, "obj-class",
				      v ? v->name : "NV1_NULL");

			return;
		}
	}

	fprintf(stderr, "Too many objects\n");
}